

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImg<float> *
cimg_library::CImg<float>::vector
          (CImg<float> *__return_storage_ptr__,float *a0,float *a1,float *a2,float *a3,float *a4,
          float *a5,float *a6,float *a7)

{
  float *pfVar1;
  int iVar2;
  
  if (vector(float_const&,float_const&,float_const&,float_const&,float_const&,float_const&,float_const&,float_const&)
      ::r == '\0') {
    iVar2 = __cxa_guard_acquire(&vector(float_const&,float_const&,float_const&,float_const&,float_const&,float_const&,float_const&,float_const&)
                                 ::r);
    if (iVar2 != 0) {
      CImg(&vector::r,1,8,1,1);
      __cxa_atexit(~CImg,&vector::r,&__dso_handle);
      __cxa_guard_release(&vector(float_const&,float_const&,float_const&,float_const&,float_const&,float_const&,float_const&,float_const&)
                           ::r);
    }
  }
  pfVar1 = vector::r._data;
  *vector::r._data = *a0;
  pfVar1[1] = *a1;
  pfVar1[2] = *a2;
  pfVar1[3] = *a3;
  pfVar1[4] = *a4;
  pfVar1[5] = *a5;
  pfVar1[6] = *a6;
  pfVar1[7] = *a7;
  CImg(__return_storage_ptr__,&vector::r);
  return __return_storage_ptr__;
}

Assistant:

static CImg<T> vector(const T& a0, const T& a1, const T& a2, const T& a3,
                          const T& a4, const T& a5, const T& a6, const T& a7) {
      _cimg_static CImg<T> r(1,8); T *ptr = r._data;
      *(ptr++) = a0; *(ptr++) = a1; *(ptr++) = a2; *(ptr++) = a3;
      *(ptr++) = a4; *(ptr++) = a5; *(ptr++) = a6; *(ptr++) = a7;
      return r;
    }